

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav_read_pcm_frames_s16(ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  float fVar1;
  double dVar2;
  uint uVar3;
  ma_uint64 mVar4;
  ma_uint64 mVar5;
  ma_int16 *pmVar6;
  ushort uVar7;
  uint shift;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ulong uVar15;
  uint j;
  long lVar16;
  float fVar17;
  double dVar18;
  undefined8 local_1038;
  
  if (framesToRead == 0 || pWav == (ma_dr_wav *)0x0) goto LAB_00168917;
  if (pBufferOut == (ma_int16 *)0x0) {
    mVar4 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,(void *)0x0);
    return mVar4;
  }
  mVar4 = 0;
  switch(pWav->translatedFormatTag) {
  case 1:
    memset(&local_1038,0,0x1000);
    uVar7 = pWav->bitsPerSample;
    if (uVar7 == 0x10) {
      mVar4 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,pBufferOut);
      return mVar4;
    }
    if ((uVar7 & 7) == 0) {
      uVar8 = (uint)(pWav->fmt).channels * (uint)uVar7 >> 3;
    }
    else {
      uVar8 = (uint)(pWav->fmt).blockAlign;
    }
    if (uVar8 != 0) {
      uVar7 = pWav->channels;
      uVar12 = (ulong)uVar8 / (ulong)uVar7;
      if (uVar8 < uVar7) {
        return 0;
      }
      if (uVar8 % (uint)uVar7 != 0) {
        return 0;
      }
      mVar4 = 0;
      uVar3 = (uint)uVar12;
      do {
        uVar15 = 0x1000 / (ulong)uVar8;
        if (framesToRead < 0x1000 / (ulong)uVar8) {
          uVar15 = framesToRead;
        }
        mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar15,&local_1038);
        if (mVar5 == 0) {
          return mVar4;
        }
        lVar10 = pWav->channels * mVar5;
        if (0x1000 < lVar10 * uVar12) {
          return mVar4;
        }
        switch(uVar3) {
        case 1:
          if (lVar10 != 0) {
            lVar11 = 0;
            do {
              pBufferOut[lVar11] = (ushort)*(byte *)((long)&local_1038 + lVar11) << 8 ^ 0x8000;
              lVar11 = lVar11 + 1;
            } while (lVar10 - lVar11 != 0);
          }
          break;
        case 2:
          if (lVar10 != 0) {
            memcpy(pBufferOut,&local_1038,lVar10 * 2);
          }
          break;
        case 3:
          if (lVar10 != 0) {
            pmVar6 = (ma_int16 *)((long)&local_1038 + 1);
            lVar11 = 0;
            do {
              pBufferOut[lVar11] = *pmVar6;
              lVar11 = lVar11 + 1;
              pmVar6 = (ma_int16 *)((long)pmVar6 + 3);
            } while (lVar10 - lVar11 != 0);
          }
          break;
        case 4:
          if (lVar10 != 0) {
            lVar11 = 0;
            do {
              pBufferOut[lVar11] = *(ma_int16 *)((long)&local_1038 + lVar11 * 4 + 2);
              lVar11 = lVar11 + 1;
            } while (lVar10 - lVar11 != 0);
          }
          break;
        default:
          if (uVar3 < 9) {
            if (lVar10 != 0) {
              lVar11 = 0;
              puVar13 = &local_1038;
              pmVar6 = pBufferOut;
              do {
                lVar16 = 0;
                uVar14 = 0;
                uVar15 = uVar12;
                iVar9 = uVar3 * -8 + 0x40;
                do {
                  uVar14 = uVar14 | (ulong)*(byte *)((long)puVar13 + lVar16) << ((byte)iVar9 & 0x3f)
                  ;
                  iVar9 = iVar9 + 8;
                  lVar16 = lVar16 + 1;
                  uVar15 = uVar15 - 1;
                } while (uVar15 != 0);
                puVar13 = (undefined8 *)((long)puVar13 + uVar12);
                *pmVar6 = (ma_int16)(uVar14 >> 0x30);
                pmVar6 = pmVar6 + 1;
                lVar11 = lVar11 + 1;
              } while (lVar11 != lVar10);
            }
          }
          else {
            memset(pBufferOut,0,lVar10 * 2);
          }
        }
        pBufferOut = pBufferOut + lVar10;
        mVar4 = mVar4 + mVar5;
        framesToRead = framesToRead - mVar5;
      } while (framesToRead != 0);
      return mVar4;
    }
    goto LAB_00168917;
  case 2:
    mVar4 = ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav,framesToRead,pBufferOut);
    return mVar4;
  case 3:
    memset(&local_1038,0,0x1000);
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar8 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
    }
    else {
      uVar8 = (uint)(pWav->fmt).blockAlign;
    }
    if (uVar8 != 0) {
      uVar7 = pWav->channels;
      uVar3 = uVar8 / uVar7;
      if (uVar8 < uVar7) {
        return 0;
      }
      if (uVar8 % (uint)uVar7 != 0) {
        return 0;
      }
      mVar4 = 0;
      do {
        uVar12 = 0x1000 / (ulong)uVar8;
        if (framesToRead < 0x1000 / (ulong)uVar8) {
          uVar12 = framesToRead;
        }
        mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar12,&local_1038);
        if (mVar5 == 0) {
          return mVar4;
        }
        lVar10 = pWav->channels * mVar5;
        if (0x1000 < lVar10 * (ulong)uVar3) {
          return mVar4;
        }
        if (uVar3 == 8) {
          if (lVar10 != 0) {
            lVar11 = 0;
            do {
              dVar2 = (double)(&local_1038)[lVar11];
              uVar7 = 0x8000;
              if (-1.0 <= dVar2) {
                dVar18 = 1.0;
                if (dVar2 <= 1.0) {
                  dVar18 = dVar2;
                }
                uVar7 = (ushort)(int)((dVar18 + 1.0) * 32767.5) ^ 0x8000;
              }
              pBufferOut[lVar11] = uVar7;
              lVar11 = lVar11 + 1;
            } while (lVar10 - lVar11 != 0);
          }
        }
        else if (uVar3 == 4) {
          if (lVar10 != 0) {
            lVar11 = 0;
            do {
              fVar1 = *(float *)((long)&local_1038 + lVar11 * 4);
              uVar7 = 0x8000;
              if (-1.0 <= fVar1) {
                fVar17 = 1.0;
                if (fVar1 <= 1.0) {
                  fVar17 = fVar1;
                }
                uVar7 = (ushort)(int)((fVar17 + 1.0) * 32767.5) ^ 0x8000;
              }
              pBufferOut[lVar11] = uVar7;
              lVar11 = lVar11 + 1;
            } while (lVar10 - lVar11 != 0);
          }
        }
        else {
          memset(pBufferOut,0,lVar10 * 2);
        }
        pBufferOut = pBufferOut + lVar10;
        mVar4 = mVar4 + mVar5;
        framesToRead = framesToRead - mVar5;
      } while (framesToRead != 0);
      return mVar4;
    }
LAB_00168917:
    mVar4 = 0;
    break;
  case 4:
  case 5:
    break;
  case 6:
    memset(&local_1038,0,0x1000);
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar7 = (pWav->fmt).channels;
      uVar8 = (uint)pWav->bitsPerSample * (uint)uVar7 >> 3;
    }
    else {
      uVar8 = (uint)(pWav->fmt).blockAlign;
      uVar7 = (pWav->fmt).channels;
    }
    mVar4 = 0;
    if ((uVar8 != 0) && (uVar8 == uVar7)) {
      uVar7 = pWav->channels;
      mVar4 = 0;
      if ((uVar7 <= uVar8) && ((short)((uVar8 & 0xffff) % (uint)uVar7) == 0)) {
        mVar4 = 0;
        uVar12 = (ulong)(ushort)(0x1000 / (uVar8 & 0xffff));
        do {
          uVar15 = uVar12;
          if (framesToRead < uVar12) {
            uVar15 = framesToRead;
          }
          mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar15,&local_1038);
          if (mVar5 == 0) {
            return mVar4;
          }
          lVar10 = pWav->channels * mVar5;
          if (0x1000 < lVar10 * (ulong)(ushort)((uVar8 & 0xffff) / (uint)uVar7)) {
            return mVar4;
          }
          if (lVar10 != 0) {
            lVar11 = 0;
            do {
              pBufferOut[lVar11] = g_ma_dr_wavAlawTable[*(byte *)((long)&local_1038 + lVar11)];
              lVar11 = lVar11 + 1;
            } while (lVar10 - lVar11 != 0);
          }
          pBufferOut = pBufferOut + lVar10;
          mVar4 = mVar4 + mVar5;
          framesToRead = framesToRead - mVar5;
        } while (framesToRead != 0);
      }
    }
    break;
  case 7:
    memset(&local_1038,0,0x1000);
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar7 = (pWav->fmt).channels;
      uVar8 = (uint)pWav->bitsPerSample * (uint)uVar7 >> 3;
    }
    else {
      uVar8 = (uint)(pWav->fmt).blockAlign;
      uVar7 = (pWav->fmt).channels;
    }
    mVar4 = 0;
    if ((uVar8 != 0) && (mVar4 = 0, uVar8 == uVar7)) {
      uVar7 = pWav->channels;
      mVar4 = 0;
      if ((uVar7 <= uVar8) && ((short)((uVar8 & 0xffff) % (uint)uVar7) == 0)) {
        mVar4 = 0;
        uVar12 = (ulong)(ushort)(0x1000 / (uVar8 & 0xffff));
        do {
          uVar15 = uVar12;
          if (framesToRead < uVar12) {
            uVar15 = framesToRead;
          }
          mVar5 = ma_dr_wav_read_pcm_frames(pWav,uVar15,&local_1038);
          if (mVar5 == 0) {
            return mVar4;
          }
          lVar10 = pWav->channels * mVar5;
          if (0x1000 < lVar10 * (ulong)(ushort)((uVar8 & 0xffff) / (uint)uVar7)) {
            return mVar4;
          }
          if (lVar10 != 0) {
            lVar11 = 0;
            do {
              pBufferOut[lVar11] = g_ma_dr_wavMulawTable[*(byte *)((long)&local_1038 + lVar11)];
              lVar11 = lVar11 + 1;
            } while (lVar10 - lVar11 != 0);
          }
          pBufferOut = pBufferOut + lVar10;
          mVar4 = mVar4 + mVar5;
          framesToRead = framesToRead - mVar5;
        } while (framesToRead != 0);
      }
    }
    break;
  default:
    if (pWav->translatedFormatTag == 0x11) {
      mVar4 = ma_dr_wav_read_pcm_frames_s16__ima(pWav,framesToRead,pBufferOut);
      return mVar4;
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s16(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_wav_read_pcm_frames(pWav, framesToRead, NULL);
    }
    if (framesToRead * pWav->channels * sizeof(ma_int16) > MA_SIZE_MAX) {
        framesToRead = MA_SIZE_MAX / sizeof(ma_int16) / pWav->channels;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_PCM) {
        return ma_dr_wav_read_pcm_frames_s16__pcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_IEEE_FLOAT) {
        return ma_dr_wav_read_pcm_frames_s16__ieee(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW) {
        return ma_dr_wav_read_pcm_frames_s16__alaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        return ma_dr_wav_read_pcm_frames_s16__mulaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s16__ima(pWav, framesToRead, pBufferOut);
    }
    return 0;
}